

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.c
# Opt level: O0

void * ossl_sa_get(OPENSSL_SA *sa,ossl_uintmax_t n)

{
  void *local_40;
  void *r;
  void **p;
  int level;
  ossl_uintmax_t n_local;
  OPENSSL_SA *sa_local;
  void *local_8;
  
  r = (void *)0x0;
  if ((sa == (OPENSSL_SA *)0x0) || (sa->nelem == 0)) {
    local_8 = (void *)0x0;
  }
  else {
    if (n <= sa->top) {
      level = sa->levels;
      for (p = sa->nodes; level = level + -1, p != (void **)0x0 && 0 < level;
          p = (void **)p[n >> ((char)level * '\f' & 0x3fU) & 0xfff]) {
      }
      if (p == (void **)0x0) {
        local_40 = (void *)0x0;
      }
      else {
        local_40 = p[n & 0xfff];
      }
      r = local_40;
    }
    local_8 = r;
  }
  return local_8;
}

Assistant:

void *ossl_sa_get(const OPENSSL_SA *sa, ossl_uintmax_t n)
{
    int level;
    void **p, *r = NULL;

    if (sa == NULL || sa->nelem == 0)
        return NULL;

    if (n <= sa->top) {
        p = sa->nodes;
        for (level = sa->levels - 1; p != NULL && level > 0; level--)
            p = (void **)p[(n >> (OPENSSL_SA_BLOCK_BITS * level))
                           & SA_BLOCK_MASK];
        r = p == NULL ? NULL : p[n & SA_BLOCK_MASK];
    }
    return r;
}